

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

int __thiscall
jsoncons::jsonpath::detail::
index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  type_conflict9 tVar1;
  bool bVar2;
  int extraout_EAX;
  unsigned_long index;
  path_node_type *ppVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  result_options in_stack_00000008;
  string_view_type sv;
  error_code ec;
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  local_80;
  string_view_type local_60;
  string_view_type local_50;
  int local_40;
  undefined8 local_38;
  
  context = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             *)CONCAT44(in_register_00000034,__nfds);
  local_40 = 0;
  local_80.token_list_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)__timeout;
  local_80.token_list_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__writefds;
  local_38 = std::_V2::system_category();
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::evaluate(&local_80,
             (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&this->expr_,(reference)context,(reference)__readfds,(result_options)__exceptfds,
             (error_code *)(ulong)in_stack_00000008);
  if (local_40 == 0) {
    tVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
            is_integer<unsigned_long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_80
                      );
    if (tVar1) {
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      if (bVar2) {
        index = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                as_integer<unsigned_long>
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           &local_80);
        ppVar3 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::generate(context,(path_node_type *)
                                    local_80.token_list_.
                                    super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,index,
                            in_stack_00000008);
        pbVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            __exceptfds,index);
        base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::tail_select(&this->
                       super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                      ,context,(reference)__readfds,ppVar3,pbVar4,
                      (node_receiver_type *)
                      local_80.token_list_.
                      super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,in_stack_00000008);
        goto LAB_00311d34;
      }
    }
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_80
                      );
    if (bVar2) {
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      if (bVar2) {
        local_50 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                             ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              &local_80);
        ppVar3 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::generate(context,(path_node_type *)
                                    local_80.token_list_.
                                    super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_50,
                            in_stack_00000008);
        local_60 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                             ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              &local_80);
        pbVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            __exceptfds,&local_60);
        base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::tail_select(&this->
                       super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                      ,context,(reference)__readfds,ppVar3,pbVar4,
                      (node_receiver_type *)
                      local_80.token_list_.
                      super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,in_stack_00000008);
      }
    }
  }
LAB_00311d34:
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_80);
  return extraout_EAX;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current, 
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            std::error_code ec;
            value_type j = expr_.evaluate(context, root, current, options, ec);

            if (!ec)
            {
                if (j.template is<std::size_t>() && current.is_array())
                {
                    std::size_t start = j.template as<std::size_t>();
                    this->tail_select(context, root, 
                                      path_generator_type::generate(context, last, start, options),
                                      current.at(start), receiver, options);
                }
                else if (j.is_string() && current.is_object())
                {
                    auto sv = j.as_string_view();
                    this->tail_select(context, root, 
                                      path_generator_type::generate(context, last, sv, options),
                                      current.at(j.as_string_view()), receiver, options);
                }
            }
        }